

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::EnumDescriptorProto::ParseFromArray
          (EnumDescriptorProto *this,void *raw,size_t size)

{
  pointer pEVar1;
  uint64_t uVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t *end;
  uint uVar9;
  ulong uVar10;
  uint64_t int_value;
  uint64_t payload_length;
  uint64_t preamble;
  uint local_70;
  ushort local_6c;
  uint8_t local_6a;
  EnumDescriptorProto *local_68;
  string *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  vector<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
  *local_48;
  bitset<6UL> *local_40;
  uint64_t payload_length_1;
  
  local_48 = &this->value_;
  std::
  vector<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
  ::clear(local_48);
  local_50 = &this->reserved_name_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(local_50);
  local_58 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  end = (uint64_t *)(size + (long)raw);
  uVar8 = 0;
  local_68 = this;
  do {
    if (end <= raw) goto switchD_002a49d8_caseD_3;
    preamble = 0;
    if ((long)(char)*raw < 0) {
      puVar5 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&preamble);
      if (puVar5 != (uint64_t *)raw) goto LAB_002a49a0;
LAB_002a4d2d:
      uVar8 = 0;
      uVar6 = 0;
      goto LAB_002a4acf;
    }
    puVar5 = (uint64_t *)((long)raw + 1);
    preamble = (long)(char)*raw;
LAB_002a49a0:
    uVar2 = preamble;
    uVar10 = preamble >> 3;
    uVar9 = (uint)uVar10;
    if ((uVar9 == 0) || (end <= puVar5)) goto LAB_002a4d2d;
    int_value = 0;
    switch((uint)preamble & 7) {
    case 0:
      puVar4 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar5,(uint8_t *)end,&int_value);
      uVar7 = 0;
      uVar6 = 0;
      if (puVar4 == puVar5) goto LAB_002a4acf;
      break;
    case 1:
      puVar4 = puVar5 + 1;
      if (end < puVar4) goto switchD_002a49d8_caseD_3;
      int_value = *puVar5;
LAB_002a4a22:
      uVar7 = 0;
      break;
    case 2:
      puVar3 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar5,(uint8_t *)end,&payload_length)
      ;
      if ((puVar3 == puVar5) || ((ulong)((long)end - (long)puVar3) < payload_length))
      goto switchD_002a49d8_caseD_3;
      puVar4 = (uint64_t *)((long)puVar3 + payload_length);
      uVar7 = payload_length;
      int_value = (uint64_t)puVar3;
      break;
    default:
      goto switchD_002a49d8_caseD_3;
    case 5:
      puVar4 = (uint64_t *)((long)puVar5 + 4);
      if (puVar4 <= end) {
        int_value = (uint64_t)(uint)*puVar5;
        goto LAB_002a4a22;
      }
      goto switchD_002a49d8_caseD_3;
    }
    raw = puVar4;
  } while ((0xffff < uVar9) || (0xfffffff < uVar7));
  uVar8 = uVar7 | (uVar2 & 7) << 0x30 | uVar10 << 0x20;
  uVar6 = int_value;
LAB_002a4acf:
  local_40 = &local_68->_has_field_;
  local_60 = &local_68->name_;
LAB_002a4aee:
  do {
    preamble = uVar6;
    local_70 = (uint)uVar8;
    local_6a = (uint8_t)(uVar8 >> 0x30);
    uVar9 = (uint)(uVar8 >> 0x20);
    local_6c = (ushort)(uVar8 >> 0x20);
    if (local_6c == 0) {
      return end == (uint64_t *)raw;
    }
    if (local_6c < 6) {
      std::bitset<6UL>::set(local_40,(ulong)(uVar9 & 7),true);
      uVar9 = (uint)local_6c;
    }
    if ((short)uVar9 == 5) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(local_50);
      protozero::Field::get
                ((Field *)&preamble,
                 (local_68->reserved_name_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1);
    }
    else if ((uVar9 & 0xffff) == 2) {
      std::
      vector<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
      ::emplace_back<>(local_48);
      pEVar1 = (local_68->value_).
               super__Vector_base<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (*pEVar1[-1].super_CppMessageObj._vptr_CppMessageObj[4])(pEVar1 + -1,preamble,(ulong)local_70)
      ;
    }
    else if ((uVar9 & 0xffff) == 1) {
      protozero::Field::get((Field *)&preamble,local_60);
    }
    else {
      protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                ((Field *)&preamble,local_58);
    }
    do {
      if (end <= raw) {
LAB_002a4d0a:
        uVar8 = 0;
        uVar6 = 0;
        goto LAB_002a4aee;
      }
      int_value = 0;
      if ((long)(char)*raw < 0) {
        puVar5 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&int_value);
        if (puVar5 == (uint64_t *)raw) goto LAB_002a4d0a;
      }
      else {
        puVar5 = (uint64_t *)((long)raw + 1);
        int_value = (long)(char)*raw;
      }
      uVar2 = int_value;
      uVar10 = int_value >> 3;
      uVar9 = (uint)uVar10;
      if ((uVar9 == 0) || (end <= puVar5)) goto LAB_002a4d0a;
      payload_length = 0;
      switch((uint)int_value & 7) {
      case 0:
        puVar4 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar5,(uint8_t *)end,&payload_length);
        uVar7 = 0;
        uVar8 = 0;
        uVar6 = 0;
        if (puVar4 == puVar5) goto LAB_002a4aee;
        break;
      case 1:
        puVar4 = puVar5 + 1;
        if (end < puVar4) goto switchD_002a4c13_caseD_3;
        payload_length = *puVar5;
LAB_002a4c6c:
        uVar7 = 0;
        break;
      case 2:
        puVar3 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar5,(uint8_t *)end,&payload_length_1);
        if ((puVar3 == puVar5) || ((ulong)((long)end - (long)puVar3) < payload_length_1))
        goto switchD_002a4c13_caseD_3;
        puVar4 = (uint64_t *)((long)puVar3 + payload_length_1);
        uVar7 = payload_length_1;
        payload_length = (uint64_t)puVar3;
        break;
      default:
        goto switchD_002a4c13_caseD_3;
      case 5:
        puVar4 = (uint64_t *)((long)puVar5 + 4);
        if (puVar4 <= end) {
          payload_length = (uint64_t)(uint)*puVar5;
          goto LAB_002a4c6c;
        }
        goto switchD_002a4c13_caseD_3;
      }
      raw = puVar4;
    } while ((0xffff < uVar9) || (0xfffffff < uVar7));
    uVar8 = uVar7 | (uVar2 & 7) << 0x30 | uVar10 << 0x20;
    uVar6 = payload_length;
  } while( true );
switchD_002a49d8_caseD_3:
  uVar8 = 0;
  uVar6 = 0;
  goto LAB_002a4acf;
switchD_002a4c13_caseD_3:
  uVar8 = 0;
  uVar6 = 0;
  goto LAB_002a4aee;
}

Assistant:

bool EnumDescriptorProto::ParseFromArray(const void* raw, size_t size) {
  value_.clear();
  reserved_name_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* name */:
        field.get(&name_);
        break;
      case 2 /* value */:
        value_.emplace_back();
        value_.back().ParseFromArray(field.data(), field.size());
        break;
      case 5 /* reserved_name */:
        reserved_name_.emplace_back();
        field.get(&reserved_name_.back());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}